

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O1

wchar_t sig_init(EditLine *el)

{
  el_signal_t paVar1;
  wchar_t wVar2;
  sigset_t *__set;
  long lVar3;
  sigset_t oset;
  sigset_t sStack_98;
  
  paVar1 = (el_signal_t)malloc(0x4b0);
  el->el_signal = paVar1;
  if (paVar1 == (el_signal_t)0x0) {
    wVar2 = L'\xffffffff';
  }
  else {
    __set = &paVar1->sig_set;
    sigemptyset((sigset_t *)__set);
    sigaddset((sigset_t *)__set,2);
    sigaddset((sigset_t *)__set,0x14);
    sigaddset((sigset_t *)__set,3);
    sigaddset((sigset_t *)__set,1);
    sigaddset((sigset_t *)__set,0xf);
    sigaddset((sigset_t *)__set,0x12);
    sigaddset((sigset_t *)__set,0x1c);
    lVar3 = 0;
    sigprocmask(0,(sigset_t *)__set,&sStack_98);
    do {
      *(undefined8 *)((long)el->el_signal->sig_action[0].sa_mask.__val + lVar3 + -8) =
           0xffffffffffffffff;
      paVar1 = el->el_signal;
      *(undefined4 *)((long)(&paVar1->sig_action[0].sa_mask + 1) + lVar3) = 0;
      sigemptyset((sigset_t *)((long)paVar1->sig_action[0].sa_mask.__val + lVar3));
      lVar3 = lVar3 + 0x98;
    } while (lVar3 != 0x428);
    wVar2 = L'\0';
    sigprocmask(2,&sStack_98,(sigset_t *)0x0);
  }
  return wVar2;
}

Assistant:

libedit_private int
sig_init(EditLine *el)
{
	size_t i;
	sigset_t *nset, oset;

	el->el_signal = el_malloc(sizeof(*el->el_signal));
	if (el->el_signal == NULL)
		return -1;

	nset = &el->el_signal->sig_set;
	(void) sigemptyset(nset);
#define	_DO(a) (void) sigaddset(nset, a);
	ALLSIGS
#undef	_DO
	(void) sigprocmask(SIG_BLOCK, nset, &oset);

	for (i = 0; sighdl[i] != -1; i++) {
		el->el_signal->sig_action[i].sa_handler = SIG_ERR;
		el->el_signal->sig_action[i].sa_flags = 0;
		sigemptyset(&el->el_signal->sig_action[i].sa_mask);
	}

	(void) sigprocmask(SIG_SETMASK, &oset, NULL);

	return 0;
}